

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.c
# Opt level: O2

int lws_mqtt_bindata_cmp(lws_mqtt_str_t *bd1,lws_mqtt_str_t *bd2)

{
  uint8_t *__s1;
  uint8_t *__s2;
  int iVar1;
  
  iVar1 = 1;
  if (bd1->len == bd2->len) {
    __s1 = bd1->buf;
    __s2 = bd2->buf;
    if (((__s2 != (uint8_t *)0x0) == (__s1 != (uint8_t *)0x0)) &&
       (iVar1 = 0, __s1 != (uint8_t *)0x0 || __s2 != (uint8_t *)0x0)) {
      iVar1 = memcmp(__s1,__s2,(ulong)bd1->len);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int
lws_mqtt_bindata_cmp(const lws_mqtt_str_t *bd1,
		     const lws_mqtt_str_t *bd2)
{
	if (bd1->len != bd2->len)
		return 1;

	if (!!bd1->buf != !!bd2->buf)
		return 1;

	if (!bd1->buf && !bd2->buf)
		return 0;

	return memcmp(bd1->buf, bd2->buf, bd1->len);
}